

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QSimpleParsedNumber<unsigned_long_long> __thiscall
QLocaleData::stringToUnsLongLong
          (QLocaleData *this,QStringView str,int base,NumberOptions number_options)

{
  QByteArrayView num;
  undefined1 uVar1;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  QSimpleParsedNumber<unsigned_long_long> QVar2;
  QStringView in_stack_00000000;
  CharBuff buff;
  QVarLengthArray<char,_256LL> *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  QByteArrayView *in_stack_fffffffffffffe40;
  QVarLengthArray<char,_256LL> *this_00;
  undefined7 in_stack_fffffffffffffe68;
  CharBuff *in_stack_fffffffffffffea0;
  NumberMode in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  QVarLengthArray<char,_256LL> local_120;
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_120;
  memset(this_00,0xaa,0x118);
  QVarLengthArray<char,_256LL>::QVarLengthArray(this_00);
  uVar1 = numberToCLocale((QLocaleData *)CONCAT44(in_R8D,in_stack_fffffffffffffeb0),
                          in_stack_00000000,
                          (QFlagsStorageHelper<QLocale::NumberOption,_4>)
                          SUB84((ulong)lVar3 >> 0x20,0),in_stack_fffffffffffffeac,
                          in_stack_fffffffffffffea0);
  if ((bool)uVar1) {
    QByteArrayView::QByteArrayView<QVarLengthArray<char,_256LL>,_true>
              (in_stack_fffffffffffffe40,
               (QVarLengthArray<char,_256LL> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    num.m_data._0_7_ = in_stack_fffffffffffffe68;
    num.m_size = (qsizetype)this_00;
    num.m_data._7_1_ = uVar1;
    QVar2 = bytearrayToUnsLongLong(num,in_stack_fffffffffffffe3c);
  }
  else {
    QVar2 = (QSimpleParsedNumber<unsigned_long_long>)ZEXT816(0);
  }
  QVarLengthArray<char,_256LL>::~QVarLengthArray(in_stack_fffffffffffffe30);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSimpleParsedNumber<quint64>
QLocaleData::stringToUnsLongLong(QStringView str, int base,
                                 QLocale::NumberOptions number_options) const
{
    CharBuff buff;
    if (!numberToCLocale(str, number_options, IntegerMode, &buff))
        return {};

    return bytearrayToUnsLongLong(QByteArrayView(buff), base);
}